

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cpp
# Opt level: O0

ULONGLONG rdtsc(void)

{
  ulong uVar1;
  undefined8 in_RAX;
  ULONGLONG L;
  ULONGLONG H;
  
  uVar1 = rdtsc();
  return uVar1 & 0xffffffff00000000 | CONCAT44((int)((ulong)in_RAX >> 0x20),(int)uVar1);
}

Assistant:

inline ULONGLONG rdtsc()
{
    ULONGLONG H, L;
    __asm volatile ("rdtsc":"=a"(L), "=d"(H));
#ifdef _X86_
    return L;
#else
    return (H << 32) | L;
#endif
}